

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(string *str,string *pattern)

{
  char *pcVar1;
  size_t sVar2;
  allocator<char> *paVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *tmpStr;
  char *strc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resultVec;
  value_type *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_51;
  string local_50 [32];
  char *local_30;
  undefined1 local_21;
  allocator<char> *local_20;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  sVar2 = strlen(pcVar1);
  paVar3 = (allocator<char> *)operator_new__(sVar2 + 1);
  local_20 = paVar3;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)paVar3,pcVar1);
  local_21 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x115bbe);
  paVar3 = local_20;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_30 = strtok((char *)paVar3,pcVar1);
  while (local_30 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,paVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_30 = strtok((char *)0x0,pcVar1);
  }
  if (local_20 != (allocator<char> *)0x0) {
    operator_delete__(local_20);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> split(const std::string &str,const std::string &pattern)
{
    //const char* convert to char*
    char * strc = new char[strlen(str.c_str())+1];
    strcpy(strc, str.c_str());
    std::vector<std::string> resultVec;
    char* tmpStr = strtok(strc, pattern.c_str());
    while (tmpStr != NULL)
    {
        resultVec.push_back(std::string(tmpStr));
        tmpStr = strtok(NULL, pattern.c_str());
    }

    delete[] strc;

    return resultVec;
}